

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3PExprAddSelect(Parse *pParse,Expr *pExpr,Select *pSelect)

{
  Select *pSelect_local;
  Expr *pExpr_local;
  Parse *pParse_local;
  
  if (pExpr == (Expr *)0x0) {
    sqlite3SelectDelete(pParse->db,pSelect);
  }
  else {
    (pExpr->x).pSelect = pSelect;
    pExpr->flags = pExpr->flags | 0x401000;
    sqlite3ExprSetHeightAndFlags(pParse,pExpr);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3PExprAddSelect(Parse *pParse, Expr *pExpr, Select *pSelect){
  if( pExpr ){
    pExpr->x.pSelect = pSelect;
    ExprSetProperty(pExpr, EP_xIsSelect|EP_Subquery);
    sqlite3ExprSetHeightAndFlags(pParse, pExpr);
  }else{
    assert( pParse->db->mallocFailed );
    sqlite3SelectDelete(pParse->db, pSelect);
  }
}